

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O3

size_t __thiscall
bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>::popcount
          (bitview<bv::internal::bitarray_t<4096UL>::array> *this,size_t begin,size_t end)

{
  ulong uVar1;
  sbyte sVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar4 = end - begin;
  if (begin <= end && uVar4 != 0) {
    uVar5 = (uint)uVar4;
    sVar3 = 0;
    do {
      uVar6 = 0x40;
      if (uVar4 < 0x40) {
        uVar6 = (ulong)(uVar5 & 0x3f);
      }
      uVar1 = begin + uVar6;
      uVar9 = uVar1 - (uVar1 != 0) >> 6;
      bVar7 = 0x40 - (-(char)uVar1 & 0x3fU);
      sVar2 = (bVar7 < 0x41) * ('@' - bVar7);
      uVar8 = ((this->_container)._M_elems[uVar9] << sVar2) >> sVar2;
      if (begin >> 6 < uVar9) {
        bVar7 = (byte)begin & 0x3f;
        uVar8 = (this->_container)._M_elems[begin >> 6] >> bVar7 | uVar8 << 0x40 - bVar7;
      }
      else {
        uVar8 = uVar8 >> (begin & 0x3f);
        if (uVar1 <= begin) {
          uVar8 = 0;
        }
      }
      uVar4 = uVar4 - uVar6;
      sVar3 = sVar3 + POPCOUNT(uVar8);
      begin = uVar1;
    } while (uVar1 < end);
    return sVar3;
  }
  return 0;
}

Assistant:

size_t bitview<Container>::popcount(size_t begin, size_t end) const
        {
            if(is_empty_range(begin, end))
                return 0;
            
            check_valid_range(begin, end, size());
            
            size_t len = (end - begin);
            size_t rem = len % W;
            
            size_t result = 0;
            for(size_t step, p = begin;
                p < end;
                len -= step, p += step)
            {
                step = len < W ? rem : W;
                
                result += ::bv::internal::popcount(get(p, p + step));
            }
            
            return result;
        }